

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O1

size_t zzAlmostInvMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  size_t n_00;
  word *b_00;
  word *a_00;
  word *a_01;
  bool_t bVar1;
  int iVar2;
  size_t n_01;
  size_t n_02;
  word wVar3;
  size_t sVar4;
  word *pwVar5;
  
  b_00 = (word *)((long)stack + n * 8);
  a_00 = b_00 + n;
  a_01 = a_00 + n + 1;
  n_00 = n + 1;
  wwSetW(a_00,n_00,1);
  wwSetZero(a_01,n_00);
  wwCopy((word *)stack,a,n);
  wwCopy(b_00,mod,n);
  n_01 = wwWordSize((word *)stack,n);
  sVar4 = 0;
  n_02 = n;
  do {
    bVar1 = zzIsEven(b_00,n_02);
    pwVar5 = a_00;
    if (bVar1 == 0) {
      bVar1 = zzIsEven((word *)stack,n_01);
      if (bVar1 == 0) {
        iVar2 = wwCmp2(b_00,n_02,(word *)stack,n_01);
        if (iVar2 < 1) {
          wVar3 = zzSub2((word *)stack,b_00,n_02);
          zzSubW2((word *)((long)stack + n_02 * 8),n_01 - n_02,wVar3);
          wwShLo((word *)stack,n_01,1);
          n_01 = wwWordSize((word *)stack,n_01);
          zzAdd2(a_00,a_01,n_00);
          pwVar5 = a_01;
        }
        else {
          wVar3 = zzSub2(b_00,(word *)stack,n_01);
          zzSubW2(b_00 + n_01,n_02 - n_01,wVar3);
          wwShLo(b_00,n_02,1);
          n_02 = wwWordSize(b_00,n_02);
          zzAdd2(a_01,a_00,n_00);
        }
      }
      else {
        wwShLo((word *)stack,n_01,1);
        n_01 = wwWordSize((word *)stack,n_01);
        pwVar5 = a_01;
      }
    }
    else {
      wwShLo(b_00,n_02,1);
      n_02 = wwWordSize(b_00,n_02);
    }
    wwShHi(pwVar5,n_00,1);
    sVar4 = sVar4 + 1;
    bVar1 = wwIsZero((word *)stack,n_01);
  } while (bVar1 == 0);
  bVar1 = wwIsW(b_00,n_02,1);
  if (bVar1 == 0) {
    wwSetZero(b,n);
  }
  iVar2 = wwCmp2(a_01,n_00,mod,n);
  if (-1 < iVar2) {
    wVar3 = zzSub2(a_01,mod,n);
    a_01[n] = a_01[n] - wVar3;
  }
  zzNegMod(b,a_01,mod,n);
  return sVar4;
}

Assistant:

size_t zzAlmostInvMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	register size_t k = 0;
	size_t nu, nv;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	word* da0 = v + n;
	word* da = da0 + n + 1;
	stack = da + n + 1;
	// pre
	ASSERT(!wwIsZero(a, n));
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	// da0 <- 1, da <- 0
	wwSetW(da0, n + 1, 1);
	wwSetZero(da, n + 1);
	// u <- a, v <- mod
	wwCopy(u, a, n);
	wwCopy(v, mod, n);
	nu = wwWordSize(u, n);
	nv = n;
	// пока (u != 0)
	do
	{
		// v -- четное?
		if (zzIsEven(v, nv))
		{
			wwShLo(v, nv, 1);
			nv = wwWordSize(v, nv);
			wwShHi(da0, n + 1, 1);
		}
		// u -- четное?
		else if (zzIsEven(u, nu))
		{
			wwShLo(u, nu, 1);
			nu = wwWordSize(u, nu);
			wwShHi(da, n + 1, 1);
		}
		// v > u?
		else if (wwCmp2(v, nv, u, nu) > 0)
		{
			ASSERT(nv >= nu);
			zzSubW2(v + nu, nv - nu, zzSub2(v, u, nu));
			wwShLo(v, nv, 1);
			nv = wwWordSize(v, nv);
			zzAdd2(da, da0, n + 1);
			wwShHi(da0, n + 1, 1);
		}
		// u >= v?
		else
		{
			ASSERT(nu >= nv);
			zzSubW2(u + nv, nu - nv, zzSub2(u, v, nv));
			wwShLo(u, nu, 1);
			nu = wwWordSize(u, nu);
			zzAdd2(da0, da, n + 1);
			wwShHi(da, n + 1, 1);
		}
		// k <- k + 1
		k = k + 1;
	} while (!wwIsZero(u, nu));
	// здесь v == (a, mod)
	EXPECT(wwIsW(v, nv, 1));
	// \gcd(a, mod) != 1? b <- 0
	if (!wwIsW(v, nv, 1))
		wwSetZero(b, n);
	// da >= mod => da -= mod
	if (wwCmp2(da, n + 1, mod, n) >= 0)
		da[n] -= zzSub2(da, mod, n);
	ASSERT(wwCmp2(da, n + 1, mod, n) < 0);
	// b <- mod - da
	zzNegMod(b, da, mod, n);
	// возврат
	return k;
}